

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O2

char read_tag(char *dst,size_t dstlen,int *is_end_tag,char **s,size_t *slen,out_stream_info *stream)

{
  byte prv;
  ushort **ppuVar1;
  ulong uVar2;
  
  prv = 0x3c;
  do {
    prv = nextout_copy((char **)is_end_tag,(size_t *)s,prv,(out_stream_info *)slen);
    if ((char)prv < '\0') break;
    ppuVar1 = __ctype_b_loc();
  } while ((*(byte *)((long)*ppuVar1 + (ulong)prv * 2 + 1) & 0x20) != 0);
  if ((prv == 0x5c) || (prv == 0x2f)) {
    *(undefined4 *)dstlen = 1;
    do {
      prv = nextout_copy((char **)is_end_tag,(size_t *)s,prv,(out_stream_info *)slen);
      if ((char)prv < '\0') break;
      ppuVar1 = __ctype_b_loc();
    } while ((*(byte *)((long)*ppuVar1 + (ulong)prv * 2 + 1) & 0x20) != 0);
  }
  else {
    *(undefined4 *)dstlen = 0;
  }
  uVar2 = 0x32;
  while ((prv != 0 &&
         (((char)prv < '\0' ||
          ((ppuVar1 = __ctype_b_loc(), prv != 0x3e && (((*ppuVar1)[prv] & 0x2000) == 0))))))) {
    if (1 < uVar2) {
      *dst = prv;
      dst = (char *)((byte *)dst + 1);
      uVar2 = uVar2 - 1;
    }
    prv = nextout_copy((char **)is_end_tag,(size_t *)s,prv,(out_stream_info *)slen);
  }
  if (uVar2 != 0) {
    *dst = 0;
  }
  return prv;
}

Assistant:

static char read_tag(char *dst, size_t dstlen, int *is_end_tag,
                     char **s, size_t *slen, out_stream_info *stream)
{
    char c;
    
    /* skip the opening '<' */
    c = nextout_copy(s, slen, '<', stream);

    /* skip spaces */
    while (outissp(c))
        c = nextout_copy(s, slen, c, stream);

    /* note if this is a closing tag */
    if (c == '/' || c == '\\')
    {
        /* it's an end tag - note it and skip the slash */
        *is_end_tag = TRUE;
        c = nextout_copy(s, slen, c, stream);

        /* skip yet more spaces */
        while (outissp(c))
            c = nextout_copy(s, slen, c, stream);
    }
    else
        *is_end_tag = FALSE;
    
    /* 
     *   find the end of the tag name - the tag continues to the next space,
     *   '>', or end of line 
     */
    for ( ; c != '\0' && !outissp(c) && c != '>' ;
         c = nextout_copy(s, slen, c, stream))
    {
        /* add this to the tag buffer if it fits */
        if (dstlen > 1)
        {
            *dst++ = c;
            --dstlen;
        }
    }
    
    /* null-terminate the tag name */
    if (dstlen > 0)
        *dst = '\0';

    /* return the next character */
    return c;
}